

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

void __thiscall soul::CodeLocation::throwError(CodeLocation *this,CompileMessage *message)

{
  CodeLocation local_60;
  CompileMessage local_50;
  CompileMessage *local_18;
  CompileMessage *message_local;
  CodeLocation *this_local;
  
  local_18 = message;
  message_local = (CompileMessage *)this;
  CodeLocation(&local_60,this);
  CompileMessage::withLocation(&local_50,message,&local_60);
  soul::throwError(&local_50);
}

Assistant:

[[noreturn]] void CodeLocation::throwError (CompileMessage message) const
{
    soul::throwError (message.withLocation (*this));
}